

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall capnp::compiler::NodeTranslator::~NodeTranslator(NodeTranslator *this)

{
  NodeTranslator *this_local;
  
  kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::~Vector(&this->unfinishedValues);
  kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::~Vector(&this->paramStructs);
  kj::Vector<capnp::compiler::NodeTranslator::AuxNode>::~Vector(&this->groups);
  Orphan<capnp::schema::Node::SourceInfo>::~Orphan(&this->sourceInfo);
  Orphan<capnp::schema::Node>::~Orphan(&this->wipNode);
  kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own(&this->localBrand);
  return;
}

Assistant:

NodeTranslator::~NodeTranslator() noexcept(false) {}